

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3OpenTempDatabase(Parse *pParse)

{
  sqlite3 *db;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  Btree *pBt;
  Btree *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  iVar1 = 0;
  if ((db->aDb[1].pBt == (Btree *)0x0) && (iVar1 = 0, pParse->explain == '\0')) {
    local_28 = (Btree *)&DAT_aaaaaaaaaaaaaaaa;
    iVar1 = sqlite3BtreeOpen(db->pVfs,(char *)0x0,db,&local_28,0,0x21e);
    if (iVar1 == 0) {
      db->aDb[1].pBt = local_28;
      iVar1 = 0;
      iVar2 = sqlite3BtreeSetPageSize(local_28,db->nextPagesize,0,0);
      if (iVar2 != 7) goto LAB_00134e77;
      sqlite3OomFault(db);
    }
    else {
      sqlite3ErrorMsg(pParse,"unable to open a temporary database file for storing temporary tables"
                     );
      pParse->rc = iVar1;
    }
    iVar1 = 1;
  }
LAB_00134e77:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTempDatabase(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( db->aDb[1].pBt==0 && !pParse->explain ){
    int rc;
    Btree *pBt;
    static const int flags =
          SQLITE_OPEN_READWRITE |
          SQLITE_OPEN_CREATE |
          SQLITE_OPEN_EXCLUSIVE |
          SQLITE_OPEN_DELETEONCLOSE |
          SQLITE_OPEN_TEMP_DB;

    rc = sqlite3BtreeOpen(db->pVfs, 0, db, &pBt, 0, flags);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorMsg(pParse, "unable to open a temporary database "
        "file for storing temporary tables");
      pParse->rc = rc;
      return 1;
    }
    db->aDb[1].pBt = pBt;
    assert( db->aDb[1].pSchema );
    if( SQLITE_NOMEM==sqlite3BtreeSetPageSize(pBt, db->nextPagesize, 0, 0) ){
      sqlite3OomFault(db);
      return 1;
    }
  }
  return 0;
}